

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleTextWidget::selection
          (QAccessibleTextWidget *this,int selectionIndex,int *startOffset,int *endOffset)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  *in_RDX = 0;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*in_RDI + 0x158))(&local_10);
  if ((in_ESI == 0) && (uVar2 = QTextCursor::hasSelection(), (uVar2 & 1) != 0)) {
    uVar1 = QTextCursor::selectionStart();
    *in_RDX = uVar1;
    uVar1 = QTextCursor::selectionEnd();
    *in_RCX = uVar1;
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTextWidget::selection(int selectionIndex, int *startOffset, int *endOffset) const
{
    *startOffset = *endOffset = 0;
    QTextCursor cursor = textCursor();

    if (selectionIndex != 0 || !cursor.hasSelection())
        return;

    *startOffset = cursor.selectionStart();
    *endOffset = cursor.selectionEnd();
}